

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx11.cc
# Opt level: O0

void do_regex(void)

{
  bool bVar1;
  __type_conflict _Var2;
  const_reference pvVar3;
  const_reference pvVar4;
  size_t sVar5;
  value_type *pvVar6;
  const_reference pvVar7;
  string_type local_4a8;
  string_type local_488;
  undefined1 local_468 [8];
  cregex_iterator m3;
  char *str7;
  regex expr4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  value_type *local_3c0;
  smatch *match2;
  sregex_iterator iter;
  sregex_iterator m2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_328;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  undefined1 local_318 [8];
  sregex_iterator m1;
  string local_2d0 [8];
  string str6;
  regex expr3;
  string_type local_270;
  string_type local_250;
  string_type local_230;
  string_type local_210;
  string_type local_1f0;
  string_type local_1d0;
  string_type local_1b0;
  string_type local_190;
  char *local_170;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  undefined1 local_160 [8];
  string s;
  smatch match1;
  undefined1 local_118 [8];
  string str5;
  undefined1 local_f0 [8];
  string str4;
  undefined1 local_c8 [8];
  string str3;
  undefined1 local_a0 [8];
  string str2;
  undefined1 local_78 [8];
  string str1;
  undefined1 local_48 [8];
  regex expr2;
  regex expr1;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &expr2._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"([0-9]+)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_48,
             "([0-9]+)\\s*([a-z]+)[[:space:]]*([0-9]+)",0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,"one 234 fifth 678 nine",
             (allocator<char> *)(str2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(str2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,"234 five 678 nine",
             (allocator<char> *)(str3.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(str3.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"one 234 five 678",
             (allocator<char> *)(str4.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(str4.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f0,"234",(allocator<char> *)(str5.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(str5.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_118,"234 five 678",
             (allocator<char> *)((long)&match1._M_begin._M_current + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&match1._M_begin._M_current + 7));
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)((long)&s.field_2 + 8));
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)((long)&s.field_2 + 8),
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     &expr2._M_automaton.
                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!std::regex_match(str1, match1, expr1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x14e,"void do_regex()");
  }
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)((long)&s.field_2 + 8),
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     &expr2._M_automaton.
                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!std::regex_match(str2, match1, expr1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x14f,"void do_regex()");
  }
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)((long)&s.field_2 + 8),
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     &expr2._M_automaton.
                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!std::regex_match(str3, match1, expr1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x150,"void do_regex()");
  }
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)((long)&s.field_2 + 8),
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                     &expr2._M_automaton.
                      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,0);
  if (!bVar1) {
    __assert_fail("std::regex_match(str4, match1, expr1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x151,"void do_regex()");
  }
  pvVar3 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),0);
  pvVar4 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),1);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pvVar3,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)pvVar4);
  if (!bVar1) {
    __assert_fail("match1[0].first == match1[1].first",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x152,"void do_regex()");
  }
  pvVar3 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),0);
  pvVar4 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),1);
  bVar1 = __gnu_cxx::operator==
                    (&(pvVar3->
                      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).second,
                     &(pvVar4->
                      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).second);
  if (!bVar1) {
    __assert_fail("match1[0].second == match1[1].second",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x153,"void do_regex()");
  }
  std::__cxx11::string::string((string *)local_160);
  pvVar3 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),1);
  local_168._M_current =
       (pvVar3->
       super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ).first._M_current;
  pvVar3 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),1);
  local_170 = (pvVar3->
              super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).second._M_current;
  std::__cxx11::string::assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)local_160,local_168,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_170);
  bVar1 = std::operator==("234",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_160);
  if (!bVar1) {
    __assert_fail("\"234\" == s",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x156,"void do_regex()");
  }
  pvVar3 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),1);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str(&local_190,pvVar3);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_160,&local_190);
  if (!_Var2) {
    __assert_fail("s == match1[1].str()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x157,"void do_regex()");
  }
  std::__cxx11::string::~string((string *)&local_190);
  bVar1 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)((long)&s.field_2 + 8),
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_48,0);
  if (!bVar1) {
    __assert_fail("std::regex_match(str5, match1, expr2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x158,"void do_regex()");
  }
  pvVar3 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),0);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str(&local_1b0,pvVar3);
  bVar1 = std::operator==("234 five 678",&local_1b0);
  if (!bVar1) {
    __assert_fail("\"234 five 678\" == match1[0].str()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x159,"void do_regex()");
  }
  std::__cxx11::string::~string((string *)&local_1b0);
  pvVar3 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),1);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str(&local_1d0,pvVar3);
  bVar1 = std::operator==("234",&local_1d0);
  if (!bVar1) {
    __assert_fail("\"234\" == match1[1].str()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x15a,"void do_regex()");
  }
  std::__cxx11::string::~string((string *)&local_1d0);
  pvVar3 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),2);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str(&local_1f0,pvVar3);
  bVar1 = std::operator==("five",&local_1f0);
  if (!bVar1) {
    __assert_fail("\"five\" == match1[2].str()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x15b,"void do_regex()");
  }
  std::__cxx11::string::~string((string *)&local_1f0);
  pvVar3 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),3);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str(&local_210,pvVar3);
  bVar1 = std::operator==("678",&local_210);
  if (!bVar1) {
    __assert_fail("\"678\" == match1[3].str()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x15c,"void do_regex()");
  }
  std::__cxx11::string::~string((string *)&local_210);
  bVar1 = std::
          regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)((long)&s.field_2 + 8),
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_48,0);
  if (!bVar1) {
    __assert_fail("std::regex_search(str1, match1, expr2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x15d,"void do_regex()");
  }
  pvVar3 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),0);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str(&local_230,pvVar3);
  bVar1 = std::operator==("234 fifth 678",&local_230);
  if (!bVar1) {
    __assert_fail("\"234 fifth 678\" == match1[0].str()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x15e,"void do_regex()");
  }
  std::__cxx11::string::~string((string *)&local_230);
  pvVar3 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),1);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str(&local_250,pvVar3);
  bVar1 = std::operator==("234",&local_250);
  if (!bVar1) {
    __assert_fail("\"234\" == match1[1].str()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x15f,"void do_regex()");
  }
  std::__cxx11::string::~string((string *)&local_250);
  pvVar3 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),2);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str(&local_270,pvVar3);
  bVar1 = std::operator==("fifth",&local_270);
  if (!bVar1) {
    __assert_fail("\"fifth\" == match1[2].str()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x160,"void do_regex()");
  }
  std::__cxx11::string::~string((string *)&local_270);
  pvVar3 = std::__cxx11::
           match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)((long)&s.field_2 + 8),3);
  std::__cxx11::
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::str((string_type *)
        &expr3._M_automaton.
         super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount,pvVar3);
  bVar1 = std::operator==("678",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&expr3._M_automaton.
                                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
  if (!bVar1) {
    __assert_fail("\"678\" == match1[3].str()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x161,"void do_regex()");
  }
  std::__cxx11::string::~string
            ((string *)
             &expr3._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&str6.field_2 + 8),
             "[[:digit:]]+",0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d0,"asdf234erasdf9453.kgdl423asdf",
             (allocator<char> *)((long)&m1._M_match._M_begin._M_current + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&m1._M_match._M_begin._M_current + 7));
  local_328._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_320,&local_328);
  m2._M_match._M_begin._M_current = (char *)std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_330,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&m2._M_match._M_begin);
  std::__cxx11::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    *)local_318,local_320,local_330,(regex_type *)((long)&str6.field_2 + 8),0);
  std::__cxx11::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    *)&iter._M_match._M_begin);
  std::__cxx11::string::clear();
  std::__cxx11::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    *)&match2,
                   (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                    *)local_318);
  while( true ) {
    bVar1 = std::__cxx11::
            regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
            ::operator!=((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)&match2,
                         (regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)&iter._M_match._M_begin);
    if (!bVar1) break;
    local_3c0 = std::__cxx11::
                regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                ::operator*((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                             *)&match2);
    pvVar3 = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](local_3c0,0);
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)
          &expr4._M_automaton.
           super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount,pvVar3);
    std::operator+(&local_3e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &expr4._M_automaton.
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,"|");
    std::__cxx11::string::operator+=((string *)local_160,(string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string
              ((string *)
               &expr4._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&match2);
  }
  std::__cxx11::
  regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                     *)&match2);
  bVar1 = std::operator==("234|9453|423|",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_160);
  if (!bVar1) {
    __assert_fail("\"234|9453|423|\" == s",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x16d,"void do_regex()");
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&str7,"(?:(asdf)|(qwer))",0x10)
  ;
  m3._M_match._M_begin = "0asdf1qwer2";
  sVar5 = strlen("0asdf1qwer2");
  std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
  regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)local_468,
                 "0asdf1qwer2","0asdf1qwer2" + sVar5,(regex_type *)&str7,0);
  pvVar6 = std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
           operator*((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                     local_468);
  pvVar7 = std::__cxx11::
           match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
           operator[](pvVar6,0);
  std::__cxx11::sub_match<const_char_*>::str(&local_488,pvVar7);
  bVar1 = std::operator==("asdf",&local_488);
  if (!bVar1) {
    __assert_fail("\"asdf\" == (*m3)[0].str()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x173,"void do_regex()");
  }
  std::__cxx11::string::~string((string *)&local_488);
  pvVar6 = std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
           operator*((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                     local_468);
  pvVar7 = std::__cxx11::
           match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
           operator[](pvVar6,1);
  if ((pvVar7->matched & 1U) == 0) {
    __assert_fail("(*m3)[1].matched",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x174,"void do_regex()");
  }
  pvVar6 = std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
           operator*((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                     local_468);
  pvVar7 = std::__cxx11::
           match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
           operator[](pvVar6,2);
  if (((pvVar7->matched ^ 0xffU) & 1) == 0) {
    __assert_fail("!(*m3)[2].matched",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x175,"void do_regex()");
  }
  std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::operator++
            ((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)local_468);
  pvVar6 = std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
           operator*((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                     local_468);
  pvVar7 = std::__cxx11::
           match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
           operator[](pvVar6,0);
  std::__cxx11::sub_match<const_char_*>::str(&local_4a8,pvVar7);
  bVar1 = std::operator==("qwer",&local_4a8);
  if (!bVar1) {
    __assert_fail("\"qwer\" == (*m3)[0].str()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x177,"void do_regex()");
  }
  std::__cxx11::string::~string((string *)&local_4a8);
  pvVar6 = std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
           operator*((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                     local_468);
  pvVar7 = std::__cxx11::
           match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
           operator[](pvVar6,1);
  if (((pvVar7->matched ^ 0xffU) & 1) == 0) {
    __assert_fail("!(*m3)[1].matched",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                  ,0x178,"void do_regex()");
  }
  pvVar6 = std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
           operator*((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                     local_468);
  pvVar7 = std::__cxx11::
           match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
           operator[](pvVar6,2);
  if ((pvVar7->matched & 1U) != 0) {
    std::__cxx11::regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_>::
    ~regex_iterator((regex_iterator<const_char_*,_char,_std::__cxx11::regex_traits<char>_> *)
                    local_468);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&str7);
    std::__cxx11::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                       *)&iter._M_match._M_begin);
    std::__cxx11::
    regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_iterator((regex_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                       *)local_318);
    std::__cxx11::string::~string(local_2d0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&str6.field_2 + 8));
    std::__cxx11::string::~string((string *)local_160);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)((long)&s.field_2 + 8));
    std::__cxx11::string::~string((string *)local_118);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_48);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               &expr2._M_automaton.
                super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return;
  }
  __assert_fail("(*m3)[2].matched",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/cxx11.cc"
                ,0x179,"void do_regex()");
}

Assistant:

void
do_regex()
{
    // Basic match/search. Match matches whole string; search searches
    // within string. Use std::smatch for matching std::string and
    // std::cmatch for matching char const*.

    std::regex expr1("([0-9]+)");
    std::regex expr2("([0-9]+)\\s*([a-z]+)[[:space:]]*([0-9]+)");
    std::string str1("one 234 fifth 678 nine");
    std::string str2("234 five 678 nine");
    std::string str3("one 234 five 678");
    std::string str4("234");
    std::string str5("234 five 678");
    std::smatch match1;
    assert(!std::regex_match(str1, match1, expr1));
    assert(!std::regex_match(str2, match1, expr1));
    assert(!std::regex_match(str3, match1, expr1));
    assert(std::regex_match(str4, match1, expr1));
    assert(match1[0].first == match1[1].first);
    assert(match1[0].second == match1[1].second);
    std::string s;
    s.assign(match1[1].first, match1[1].second);
    assert("234" == s);
    assert(s == match1[1].str());
    assert(std::regex_match(str5, match1, expr2));
    assert("234 five 678" == match1[0].str());
    assert("234" == match1[1].str());
    assert("five" == match1[2].str());
    assert("678" == match1[3].str());
    assert(std::regex_search(str1, match1, expr2));
    assert("234 fifth 678" == match1[0].str());
    assert("234" == match1[1].str());
    assert("fifth" == match1[2].str());
    assert("678" == match1[3].str());

    // Iterator
    std::regex expr3("[[:digit:]]+");
    std::string str6 = "asdf234erasdf9453.kgdl423asdf";
    std::sregex_iterator m1(str6.begin(), str6.end(), expr3);
    std::sregex_iterator m2;
    s.clear();
    for (std::sregex_iterator iter = m1; iter != m2; ++iter) {
        std::smatch const& match2 = *iter;
        s += match2[0].str() + "|";
    }
    assert("234|9453|423|" == s);

    // Submatches
    std::regex expr4("(?:(asdf)|(qwer))");
    char const* str7 = "0asdf1qwer2";
    std::cregex_iterator m3(str7, str7 + std::strlen(str7), expr4);
    assert("asdf" == (*m3)[0].str());
    assert((*m3)[1].matched);
    assert(!(*m3)[2].matched);
    ++m3;
    assert("qwer" == (*m3)[0].str());
    assert(!(*m3)[1].matched);
    assert((*m3)[2].matched);
}